

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * __thiscall fmt::v7::format_int::format_unsigned<unsigned_int>(format_int *this,uint value)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  
  uVar2 = 0x1f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  if (0x15 < (int)((uint)*(ushort *)(detail::bsr2log10(int)::data + (ulong)uVar2 * 2) -
                  (uint)(value < *(uint *)(detail::basic_data<void>::zero_or_powers_of_10_32_new +
                                          (ulong)*(ushort *)
                                                  (detail::bsr2log10(int)::data + (ulong)uVar2 * 2)
                                          * 4)))) {
    detail::assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/spdlog/spdlog/fmt/bundled/format.h"
                        ,0x41b,"invalid digit count");
  }
  pcVar3 = this->buffer_ + 0x15;
  uVar2 = value;
  if (99 < value) {
    do {
      value = uVar2 / 100;
      *(undefined2 *)(pcVar3 + -2) =
           *(undefined2 *)(detail::basic_data<void>::digits + (ulong)(uVar2 % 100) * 2);
      pcVar3 = pcVar3 + -2;
      bVar1 = 9999 < uVar2;
      uVar2 = uVar2 / 100;
    } while (bVar1);
  }
  if (value < 10) {
    pcVar3[-1] = (byte)value | 0x30;
    pcVar3 = pcVar3 + -1;
  }
  else {
    *(undefined2 *)(pcVar3 + -2) =
         *(undefined2 *)(detail::basic_data<void>::digits + (ulong)value * 2);
    pcVar3 = pcVar3 + -2;
  }
  return pcVar3;
}

Assistant:

char* format_unsigned(UInt value) {
    auto n = static_cast<detail::uint32_or_64_or_128_t<UInt>>(value);
    return detail::format_decimal(buffer_, n, buffer_size - 1).begin;
  }